

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

GPU_Target *
GPU_InitRendererByID(GPU_RendererID renderer_request,Uint16 w,Uint16 h,GPU_WindowFlagEnum SDL_flags)

{
  GPU_RendererID id;
  _Bool _Var1;
  GPU_Renderer *pGVar2;
  GPU_Target *pGVar3;
  undefined8 unaff_RBX;
  undefined8 unaff_R12;
  undefined8 in_stack_ffffffffffffffd0;
  
  gpu_init_error_queue();
  gpu_init_renderer_register();
  _Var1 = gpu_init_SDL();
  if ((_Var1) &&
     (pGVar2 = gpu_create_and_add_renderer(renderer_request), pGVar2 != (GPU_Renderer *)0x0)) {
    id.renderer = (int)unaff_RBX;
    id.major_version = (int)((ulong)unaff_RBX >> 0x20);
    id.name = (char *)in_stack_ffffffffffffffd0;
    id._16_8_ = unaff_R12;
    GPU_SetCurrentRenderer(id);
    pGVar3 = (*pGVar2->impl->Init)(pGVar2,renderer_request,w,h,SDL_flags);
    if (pGVar3 != (GPU_Target *)0x0) {
      _gpu_init_windowID = 0;
      return pGVar3;
    }
    GPU_PushErrorCode("GPU_InitRendererByID",GPU_ERROR_BACKEND_ERROR,
                      "Renderer %s failed to initialize properly",(pGVar2->id).name);
    _gpu_num_window_mappings = 0;
    GPU_CloseCurrentRenderer();
    return (GPU_Target *)0x0;
  }
  return (GPU_Target *)0x0;
}

Assistant:

GPU_Target* GPU_InitRendererByID(GPU_RendererID renderer_request, Uint16 w, Uint16 h, GPU_WindowFlagEnum SDL_flags)
{
    GPU_Renderer* renderer;
    GPU_Target* screen;

    gpu_init_error_queue();
    gpu_init_renderer_register();

    if(!gpu_init_SDL())
        return NULL;

    renderer = gpu_create_and_add_renderer(renderer_request);
    if(renderer == NULL)
        return NULL;

    GPU_SetCurrentRenderer(renderer->id);

    screen = renderer->impl->Init(renderer, renderer_request, w, h, SDL_flags);
    if(screen == NULL)
    {
        GPU_PushErrorCode("GPU_InitRendererByID", GPU_ERROR_BACKEND_ERROR, "Renderer %s failed to initialize properly", renderer->id.name);
        // Init failed, destroy the renderer...
        // Erase the window mappings
        _gpu_num_window_mappings = 0;
        GPU_CloseCurrentRenderer();
    }
    else
        GPU_SetInitWindow(0);
    return screen;
}